

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuilderParsingCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  JavaType local_24;
  FieldDescriptor *pFStack_20;
  JavaType type;
  FieldDescriptor *value;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  value = (FieldDescriptor *)printer;
  printer_local = (Printer *)this;
  pFStack_20 = MapValueField(this->descriptor_);
  local_24 = GetJavaType(pFStack_20);
  pFVar1 = value;
  if (local_24 == JAVATYPE_MESSAGE) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().ensureBuilderMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)pFVar1,&this->variables_,local_38);
  }
  else {
    bVar2 = SupportUnknownEnumValue(pFStack_20);
    pFVar1 = value;
    if ((bVar2) || (local_24 != JAVATYPE_ENUM)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,
                 "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().getMutableMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)pFVar1,&this->variables_,local_58);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,
                 "com.google.protobuf.ByteString bytes = input.readBytes();\ncom.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\nif ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n  mergeUnknownLengthDelimitedField($number$, bytes);\n} else {\n  internalGetMutable$capitalized_name$().getMutableMap().put(\n      $name$__.getKey(), $name$__.getValue());\n  $set_has_field_bit_builder$\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)pFVar1,&this->variables_,local_48);
    }
  }
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  const FieldDescriptor* value = MapValueField(descriptor_);
  const JavaType type = GetJavaType(value);
  if (type == JAVATYPE_MESSAGE) {
    printer->Print(
        variables_,
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = input.readMessage(\n"
        "    $default_entry$.getParserForType(), extensionRegistry);\n"
        "internalGetMutable$capitalized_name$().ensureBuilderMap().put(\n"
        "    $name$__.getKey(), $name$__.getValue());\n"
        "$set_has_field_bit_builder$\n");
    return;
  }
  if (!SupportUnknownEnumValue(value) && type == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "com.google.protobuf.ByteString bytes = input.readBytes();\n"
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\n"
        "if ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n"
        "  mergeUnknownLengthDelimitedField($number$, bytes);\n"
        "} else {\n"
        "  internalGetMutable$capitalized_name$().getMutableMap().put(\n"
        "      $name$__.getKey(), $name$__.getValue());\n"
        "  $set_has_field_bit_builder$\n"
        "}\n");
    return;
  }
  printer->Print(variables_,
                 "com.google.protobuf.MapEntry<$type_parameters$>\n"
                 "$name$__ = input.readMessage(\n"
                 "    $default_entry$.getParserForType(), extensionRegistry);\n"
                 "internalGetMutable$capitalized_name$().getMutableMap().put(\n"
                 "    $name$__.getKey(), $name$__.getValue());\n"
                 "$set_has_field_bit_builder$\n");
}